

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceUtils.cpp
# Opt level: O2

BlendFunc sglr::rr_util::mapGLBlendFunc(deUint32 func)

{
  switch(func) {
  case 0x300:
    func = BLENDFUNC_SRC_COLOR;
    break;
  case 0x301:
    func = BLENDFUNC_ONE_MINUS_SRC_COLOR;
    break;
  case 0x302:
    func = BLENDFUNC_SRC_ALPHA;
    break;
  case 0x303:
    func = BLENDFUNC_ONE_MINUS_SRC_ALPHA;
    break;
  case 0x304:
    func = BLENDFUNC_DST_ALPHA;
    break;
  case 0x305:
    func = BLENDFUNC_ONE_MINUS_DST_ALPHA;
    break;
  case 0x306:
    func = BLENDFUNC_DST_COLOR;
    break;
  case 0x307:
    func = BLENDFUNC_ONE_MINUS_DST_COLOR;
    break;
  case 0x308:
    func = BLENDFUNC_SRC_ALPHA_SATURATE;
    break;
  default:
    switch(func) {
    case 0x8001:
      func = BLENDFUNC_CONSTANT_COLOR;
      break;
    case 0x8002:
      func = BLENDFUNC_ONE_MINUS_CONSTANT_COLOR;
      break;
    case 0x8003:
      func = BLENDFUNC_CONSTANT_ALPHA;
      break;
    case 0x8004:
      func = BLENDFUNC_ONE_MINUS_CONSTANT_ALPHA;
      break;
    default:
      if (1 < func) {
        if (func == 0x8589) {
          func = BLENDFUNC_SRC1_ALPHA;
        }
        else if (func == 0x88f9) {
          func = BLENDFUNC_SRC1_COLOR;
        }
        else if (func == 0x88fa) {
          func = BLENDFUNC_ONE_MINUS_SRC1_COLOR;
        }
        else if (func == 0x88fb) {
          func = BLENDFUNC_ONE_MINUS_SRC1_ALPHA;
        }
        else {
          func = BLENDFUNC_LAST;
        }
      }
    }
  }
  return func;
}

Assistant:

rr::BlendFunc mapGLBlendFunc (deUint32 func)
{
	switch (func)
	{
		case GL_ZERO:						return rr::BLENDFUNC_ZERO;
		case GL_ONE:						return rr::BLENDFUNC_ONE;
		case GL_SRC_COLOR:					return rr::BLENDFUNC_SRC_COLOR;
		case GL_ONE_MINUS_SRC_COLOR:		return rr::BLENDFUNC_ONE_MINUS_SRC_COLOR;
		case GL_DST_COLOR:					return rr::BLENDFUNC_DST_COLOR;
		case GL_ONE_MINUS_DST_COLOR:		return rr::BLENDFUNC_ONE_MINUS_DST_COLOR;
		case GL_SRC_ALPHA:					return rr::BLENDFUNC_SRC_ALPHA;
		case GL_ONE_MINUS_SRC_ALPHA:		return rr::BLENDFUNC_ONE_MINUS_SRC_ALPHA;
		case GL_DST_ALPHA:					return rr::BLENDFUNC_DST_ALPHA;
		case GL_ONE_MINUS_DST_ALPHA:		return rr::BLENDFUNC_ONE_MINUS_DST_ALPHA;
		case GL_CONSTANT_COLOR:				return rr::BLENDFUNC_CONSTANT_COLOR;
		case GL_ONE_MINUS_CONSTANT_COLOR:	return rr::BLENDFUNC_ONE_MINUS_CONSTANT_COLOR;
		case GL_CONSTANT_ALPHA:				return rr::BLENDFUNC_CONSTANT_ALPHA;
		case GL_ONE_MINUS_CONSTANT_ALPHA:	return rr::BLENDFUNC_ONE_MINUS_CONSTANT_ALPHA;
		case GL_SRC_ALPHA_SATURATE:			return rr::BLENDFUNC_SRC_ALPHA_SATURATE;
		case GL_SRC1_COLOR:					return rr::BLENDFUNC_SRC1_COLOR;
		case GL_ONE_MINUS_SRC1_COLOR:		return rr::BLENDFUNC_ONE_MINUS_SRC1_COLOR;
		case GL_SRC1_ALPHA:					return rr::BLENDFUNC_SRC1_ALPHA;
		case GL_ONE_MINUS_SRC1_ALPHA:		return rr::BLENDFUNC_ONE_MINUS_SRC1_ALPHA;
		default:
			DE_ASSERT(false);
			return rr::BLENDFUNC_LAST;
	}
}